

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O0

void duckdb::MergeValidityLoop
               (UpdateInfo *base_info,Vector *base_data,UpdateInfo *update_info,
               UnifiedVectorFormat *update,row_t *ids,idx_t count,SelectionVector *sel)

{
  ValidityMask *update_validity;
  ValidityMask *base_validity;
  row_t *in_stack_00002928;
  ValidityMask *in_stack_00002930;
  SelectionVector *in_stack_00002938;
  UpdateInfo *in_stack_00002940;
  ValidityMask *in_stack_00002948;
  UpdateInfo *in_stack_00002950;
  idx_t in_stack_00002960;
  SelectionVector *in_stack_00002968;
  
  FlatVector::Validity((Vector *)0xbc4251);
  MergeUpdateLoopInternal<bool,duckdb::ValidityMask,duckdb::ExtractValidityEntry>
            (in_stack_00002950,in_stack_00002948,in_stack_00002940,in_stack_00002938,
             in_stack_00002930,in_stack_00002928,in_stack_00002960,in_stack_00002968);
  return;
}

Assistant:

static void MergeValidityLoop(UpdateInfo &base_info, Vector &base_data, UpdateInfo &update_info,
                              UnifiedVectorFormat &update, row_t *ids, idx_t count, const SelectionVector &sel) {
	auto &base_validity = FlatVector::Validity(base_data);
	auto &update_validity = update.validity;
	MergeUpdateLoopInternal<bool, ValidityMask, ExtractValidityEntry>(base_info, &base_validity, update_info,
	                                                                  *update.sel, &update_validity, ids, count, sel);
}